

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,ImGuiSliderFlags flags)

{
  size_t sVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  float w_full;
  char *label_end;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  void *p_max_local;
  void *p_min_local;
  float v_speed_local;
  int components_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    label_local._7_1_ = false;
    BeginGroup();
    PushID(label);
    w_full = CalcItemWidth();
    PushMultiItemsWidths(components,w_full);
    sVar1 = GDataTypeInfo[data_type].Size;
    _v_speed_local = p_data;
    for (label_end._4_4_ = 0; label_end._4_4_ < components; label_end._4_4_ = label_end._4_4_ + 1) {
      PushID(label_end._4_4_);
      if (0 < label_end._4_4_) {
        SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      }
      bVar3 = DragScalar("",data_type,_v_speed_local,v_speed,p_min,p_max,format,flags);
      label_local._7_1_ = label_local._7_1_ != false || bVar3;
      PopID();
      PopItemWidth();
      _v_speed_local = (void *)((long)_v_speed_local + sVar1);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    if (label != text_end) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      TextEx(label,text_end,0);
    }
    EndGroup();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= DragScalar("", data_type, p_data, v_speed, p_min, p_max, format, flags);
        PopID();
        PopItemWidth();
        p_data = (void*)((char*)p_data + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}